

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.h
# Opt level: O0

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,StringRef Str)

{
  char *__buf;
  char *pcVar1;
  char *pcVar2;
  size_t Size;
  raw_ostream *this_local;
  StringRef Str_local;
  
  Str_local.Data = (char *)Str.Length;
  this_local = (raw_ostream *)Str.Data;
  __buf = (char *)StringRef::size((StringRef *)&this_local);
  pcVar2 = this->OutBufEnd + -(long)this->OutBufCur;
  if (pcVar2 < __buf) {
    pcVar1 = StringRef::data((StringRef *)&this_local);
    Str_local.Length = write(this,(int)pcVar1,__buf,(size_t)pcVar2);
  }
  else {
    Str_local.Length = (size_t)this;
    if (__buf != (char *)0x0) {
      pcVar2 = this->OutBufCur;
      pcVar1 = StringRef::data((StringRef *)&this_local);
      memcpy(pcVar2,pcVar1,(size_t)__buf);
      this->OutBufCur = __buf + (long)this->OutBufCur;
    }
  }
  return (raw_ostream *)Str_local.Length;
}

Assistant:

raw_ostream &operator<<(StringRef Str) {
    // Inline fast path, particularly for strings with a known length.
    size_t Size = Str.size();

    // Make sure we can use the fast path.
    if (Size > (size_t)(OutBufEnd - OutBufCur))
      return write(Str.data(), Size);

    if (Size) {
      memcpy(OutBufCur, Str.data(), Size);
      OutBufCur += Size;
    }
    return *this;
  }